

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxerManager.cpp
# Opt level: O0

bool __thiscall MuxerManager::openMetaFile(MuxerManager *this,string *fileName)

{
  TextFile *this_00;
  bool bVar1;
  char *fName;
  long lVar2;
  int __fd;
  string *line;
  allocator<char> local_a1;
  string local_a0;
  undefined1 local_70 [8];
  string str;
  TextFile file;
  string *fileName_local;
  MuxerManager *this_local;
  
  fName = (char *)std::__cxx11::string::c_str();
  this_00 = (TextFile *)((long)&str.field_2 + 8);
  TextFile::TextFile(this_00,fName,1,0);
  line = (string *)local_70;
  std::__cxx11::string::string((string *)line);
  TextFile::readLine(this_00,line);
  while( true ) {
    __fd = (int)line;
    lVar2 = std::__cxx11::string::length();
    if (lVar2 == 0) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"MUXOPT",&local_a1);
    bVar1 = strStartWith((string *)local_70,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)&this->m_muxOpts,(string *)local_70);
      parseMuxOpt(this,&this->m_muxOpts);
      lVar2 = std::__cxx11::string::find((char *)&this->m_muxOpts,0x3b4dca);
      this->m_mvcBaseViewR = lVar2 != -1;
    }
    line = (string *)local_70;
    TextFile::readLine((TextFile *)((long)&str.field_2 + 8),line);
  }
  File::close((File *)((long)&str.field_2 + 8),__fd);
  METADemuxer::openFile(&this->m_metaDemuxer,fileName);
  std::__cxx11::string::~string((string *)local_70);
  TextFile::~TextFile((TextFile *)((long)&str.field_2 + 8));
  return true;
}

Assistant:

bool MuxerManager::openMetaFile(const string& fileName)
{
    TextFile file(fileName.c_str(), File::ofRead);
    std::string str;
    file.readLine(str);
    while (str.length() > 0)
    {
        if (strStartWith(str, "MUXOPT"))
        {
            m_muxOpts = str;
            parseMuxOpt(m_muxOpts);
            m_mvcBaseViewR = m_muxOpts.find("right-eye") != string::npos;
        }
        file.readLine(str);
    }
    file.close();

    m_metaDemuxer.openFile(fileName);
    return true;
}